

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O0

void __thiscall
TPZFrontSym<float>::AddKel
          (TPZFrontSym<float> *this,TPZFMatrix<float> *elmat,TPZVec<long> *destinationindex)

{
  int iVar1;
  TPZFrontSym<float> *this_00;
  TPZFMatrix<float> *this_01;
  float *pfVar2;
  TPZVec<long> *in_RDX;
  int64_t in_RDI;
  int64_t nel;
  int64_t jlocal;
  int64_t ilocal;
  int64_t j;
  int64_t i;
  undefined4 in_stack_ffffffffffffffb0;
  float fVar3;
  TPZFrontSym<float> *in_stack_ffffffffffffffc8;
  undefined8 local_28;
  undefined8 local_20;
  
  this_00 = (TPZFrontSym<float> *)TPZVec<long>::NElements(in_RDX);
  for (local_20 = 0; local_20 < (long)this_00; local_20 = local_20 + 1) {
    TPZVec<long>::operator[](in_RDX,local_20);
    iVar1 = Local(in_stack_ffffffffffffffc8,(int64_t)this_00);
    this_01 = (TPZFMatrix<float> *)(long)iVar1;
    for (local_28 = local_20; local_28 < (long)this_00; local_28 = local_28 + 1) {
      TPZVec<long>::operator[](in_RDX,local_28);
      iVar1 = Local(in_stack_ffffffffffffffc8,(int64_t)this_00);
      in_stack_ffffffffffffffc8 = (TPZFrontSym<float> *)(long)iVar1;
      pfVar2 = TPZFMatrix<float>::operator()
                         (this_01,(int64_t)in_stack_ffffffffffffffc8,(int64_t)this_00);
      fVar3 = *pfVar2;
      pfVar2 = Element(this_00,in_RDI,CONCAT44(fVar3,in_stack_ffffffffffffffb0));
      *pfVar2 = fVar3 + *pfVar2;
    }
  }
  return;
}

Assistant:

void TPZFrontSym<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &destinationindex)
{
	int64_t i, j, ilocal, jlocal, nel;
	nel = destinationindex.NElements();
	for(i=0;i<nel;i++){
		ilocal = this->Local(destinationindex[i]);
		for(j=i;j<nel;j++) {
			jlocal=this->Local(destinationindex[j]);
			this->Element(ilocal, jlocal)+=elmat(i,j);
		}
	}
	/*
	 output << "Dest Index " ;
	 for(i=0;i<nel;i++) output << destinationindex[i] << " ";
	 output << endl;
	 elmat.Print("Element matrix ",output);
	 PrintGlobal("After Assemb..." , output);
	 */
}